

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::QAction(QAction *this,QActionPrivate *dd,QObject *parent)

{
  long lVar1;
  int *piVar2;
  QObject *pQVar3;
  undefined8 uVar4;
  
  QObject::QObject(&this->super_QObject,&dd->super_QObjectPrivate,parent);
  *(undefined ***)this = &PTR_metaObject_007f0e18;
  lVar1 = *(long *)&this->field_0x8;
  pQVar3 = (QObject *)QMetaObject::cast((QObject *)&QActionGroup::staticMetaObject);
  if (pQVar3 == (QObject *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar3);
  }
  piVar2 = *(int **)(lVar1 + 0x78);
  *(undefined8 *)(lVar1 + 0x78) = uVar4;
  *(QObject **)(lVar1 + 0x80) = pQVar3;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  if (((*(long *)(lVar1 + 0x78) != 0) && (*(int *)(*(long *)(lVar1 + 0x78) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x80) != 0)) {
    QActionGroup::addAction(*(QActionGroup **)(lVar1 + 0x80),this);
    return;
  }
  return;
}

Assistant:

QAction::QAction(QActionPrivate &dd, QObject *parent)
    : QObject(dd, parent)
{
    Q_D(QAction);
    d->group = qobject_cast<QActionGroup *>(parent);
    if (d->group)
        d->group->addAction(this);
}